

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

bool __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::
GetFreeObjectListOnAllocatorImpl<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,FreeObject **freeObjectList)

{
  HeapBucket *pHVar1;
  bool bVar2;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *pSVar3;
  SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  *local_30;
  SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  *current;
  SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  *head;
  FreeObject **freeObjectList_local;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  pHVar1 = this->heapBucket;
  local_30 = (SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
              *)(pHVar1 + 1);
  do {
    pSVar3 = SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
             ::GetHeapBlock(local_30);
    if (pSVar3 == (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)this) {
      bVar2 = SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
              ::IsFreeListAllocMode(local_30);
      if (!bVar2) {
        return false;
      }
      *freeObjectList = local_30->freeObjectList;
      return true;
    }
    local_30 = SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
               ::GetNext(local_30);
  } while (local_30 !=
           (SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
            *)(pHVar1 + 1));
  return false;
}

Assistant:

bool
SmallHeapBlockT<TBlockAttributes>::GetFreeObjectListOnAllocatorImpl(FreeObject ** freeObjectList)
{
    // not during collection, the allocator has the current info
    SmallHeapBlockAllocator<TBlockType> * head =
        &((HeapBucketT<TBlockType> *)this->heapBucket)->allocatorHead;
    SmallHeapBlockAllocator<TBlockType> * current = head;
    do
    {
        if (current->GetHeapBlock() == this)
        {
            if (current->IsFreeListAllocMode())
            {
                *freeObjectList = current->freeObjectList;
                return true;
            }
            return false;
        }
        current = current->GetNext();
    }
    while (current != head);
    return false;
}